

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

bool doctest::detail::parseFlagImpl(int argc,char **argv,char *pattern)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcStack_30;
  bool noBadCharsFound;
  char *temp;
  int i;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  temp._4_4_ = argc + -1;
  do {
    if (temp._4_4_ < 0) {
      return false;
    }
    pcStack_30 = strstr(argv[temp._4_4_],pattern);
    if (pcStack_30 != (char *)0x0) {
      sVar3 = my_strlen(pcStack_30);
      sVar4 = my_strlen(pattern);
      if (sVar3 == sVar4) {
        bVar2 = true;
        do {
          if (pcStack_30 == argv[temp._4_4_]) goto LAB_001066be;
          pcVar1 = pcStack_30 + -1;
          pcStack_30 = pcStack_30 + -1;
        } while (*pcVar1 == '-');
        bVar2 = false;
LAB_001066be:
        if ((bVar2) && (*argv[temp._4_4_] == '-')) {
          return true;
        }
      }
    }
    temp._4_4_ = temp._4_4_ + -1;
  } while( true );
}

Assistant:

bool parseFlagImpl(int argc, const char* const* argv, const char* pattern) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp && my_strlen(temp) == my_strlen(pattern)) {
                // eliminate strings in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                while(temp != argv[i]) {
                    if(*--temp != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-')
                    return true;
            }
        }
        return false;
    }